

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O0

int lyp_mmap(ly_ctx *ctx,int fd,size_t addsize,size_t *length,void **addr)

{
  int iVar1;
  int *piVar2;
  char *pcVar3;
  long lVar4;
  void *pvVar5;
  size_t m;
  long pagesize;
  stat sb;
  void **addr_local;
  size_t *length_local;
  size_t addsize_local;
  int fd_local;
  ly_ctx *ctx_local;
  
  sb.__glibc_reserved[2] = (__syscall_slong_t)addr;
  if (-1 < fd) {
    iVar1 = fstat(fd,(stat *)&pagesize);
    if (iVar1 == -1) {
      piVar2 = __errno_location();
      pcVar3 = strerror(*piVar2);
      ly_log(ctx,LY_LLERR,LY_ESYS,"Failed to stat the file descriptor (%s) for the mmap().",pcVar3);
      ctx_local._4_4_ = 1;
    }
    else if (((uint)sb.st_nlink & 0xf000) == 0x8000) {
      if (sb.st_rdev == 0) {
        *(undefined8 *)sb.__glibc_reserved[2] = 0;
        ctx_local._4_4_ = 0;
      }
      else {
        lVar4 = sysconf(0x1e);
        if (((long)sb.st_rdev % lVar4 == 0) ||
           ((ulong)(lVar4 - (long)sb.st_rdev % lVar4) < addsize + 1)) {
          *length = sb.st_rdev + lVar4;
          pvVar5 = mmap((void *)0x0,*length,3,0x22,-1,0);
          *(void **)sb.__glibc_reserved[2] = pvVar5;
          pvVar5 = mmap(*(void **)sb.__glibc_reserved[2],sb.st_rdev,3,0x12,fd,0);
          *(void **)sb.__glibc_reserved[2] = pvVar5;
        }
        else {
          *length = sb.st_rdev + addsize + 1;
          pvVar5 = mmap((void *)0x0,*length,3,2,fd,0);
          *(void **)sb.__glibc_reserved[2] = pvVar5;
        }
        if (*(long *)sb.__glibc_reserved[2] == -1) {
          piVar2 = __errno_location();
          pcVar3 = strerror(*piVar2);
          ly_log(ctx,LY_LLERR,LY_ESYS,"mmap() failed (%s).",pcVar3);
          ctx_local._4_4_ = 1;
        }
        else {
          ctx_local._4_4_ = 0;
        }
      }
    }
    else {
      ly_log(ctx,LY_LLERR,LY_EINVAL,"File to mmap() is not a regular file.");
      ctx_local._4_4_ = 1;
    }
    return ctx_local._4_4_;
  }
  __assert_fail("fd >= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/stritzinger[P]libyang/src/parser.c"
                ,0x102,"int lyp_mmap(struct ly_ctx *, int, size_t, size_t *, void **)");
}

Assistant:

int
lyp_mmap(struct ly_ctx *ctx, int fd, size_t addsize, size_t *length, void **addr)
{
    struct stat sb;
    long pagesize;
    size_t m;

    assert(fd >= 0);
    if (fstat(fd, &sb) == -1) {
        LOGERR(ctx, LY_ESYS, "Failed to stat the file descriptor (%s) for the mmap().", strerror(errno));
        return 1;
    }
    if (!S_ISREG(sb.st_mode)) {
        LOGERR(ctx, LY_EINVAL, "File to mmap() is not a regular file.");
        return 1;
    }
    if (!sb.st_size) {
        *addr = NULL;
        return 0;
    }
    pagesize = sysconf(_SC_PAGESIZE);
    ++addsize;                       /* at least one additional byte for terminating NULL byte */

    m = sb.st_size % pagesize;
    if (m && pagesize - m >= addsize) {
        /* there will be enough space after the file content mapping to provide zeroed additional bytes */
        *length = sb.st_size + addsize;
        *addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE, fd, 0);
    } else {
        /* there will not be enough bytes after the file content mapping for the additional bytes and some of them
         * would overflow into another page that would not be zeroed and any access into it would generate SIGBUS.
         * Therefore we have to do the following hack with double mapping. First, the required number of bytes
         * (including the additional bytes) is required as anonymous and thus they will be really provided (actually more
         * because of using whole pages) and also initialized by zeros. Then, the file is mapped to the same address
         * where the anonymous mapping starts. */
        *length = sb.st_size + pagesize;
        *addr = mmap(NULL, *length, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_ANONYMOUS, -1, 0);
        *addr = mmap(*addr, sb.st_size, PROT_READ | PROT_WRITE, MAP_PRIVATE | MAP_FIXED, fd, 0);
    }
    if (*addr == MAP_FAILED) {
        LOGERR(ctx, LY_ESYS, "mmap() failed (%s).", strerror(errno));
        return 1;
    }

    return 0;
}